

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O1

void __thiscall CSocekt::flyd_write_request_handler(CSocekt *this,lp_connection_t pConn)

{
  int iVar1;
  CMemory *this_00;
  ulong uVar2;
  CSocekt *this_01;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  Logger local_ff0;
  
  this_01 = this;
  this_00 = CMemory::GetInstance();
  uVar2 = sendproc(this_01,pConn,pConn->psendbuf,(ulong)pConn->isendlen);
  if (((long)uVar2 < 1) || (uVar2 == pConn->isendlen)) {
    if (uVar2 == 0xffffffffffffffff) {
      file_02._8_8_ = 0x16;
      file_02.data_ = "flyd_socket_request.cc";
      muduo::Logger::Logger(&local_ff0,file_02,0x180,ERROR);
      if (0x51 < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
        memcpy(local_ff0.impl_.stream_.buffer_.cur_,anon_var_dwarf_350e3,0x51);
        local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x51;
      }
      muduo::Logger::~Logger(&local_ff0);
    }
    else {
      if ((0 < (long)uVar2) && (uVar2 == pConn->isendlen)) {
        iVar1 = flyd_epoll_oper_event(this,pConn->fd,3,4,1,pConn);
        if (iVar1 == -1) {
          file._8_8_ = 0x16;
          file.data_ = "flyd_socket_request.cc";
          muduo::Logger::Logger(&local_ff0,file,400,ERROR);
          if (0x51 < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_))
          {
            memcpy(local_ff0.impl_.stream_.buffer_.cur_,anon_var_dwarf_350e3,0x51);
            local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x51;
          }
          muduo::Logger::~Logger(&local_ff0);
        }
        if (muduo::g_logLevel < 3) {
          file_00._8_8_ = 0x16;
          file_00.data_ = "flyd_socket_request.cc";
          muduo::Logger::Logger(&local_ff0,file_00,0x193);
          if (0x39 < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_))
          {
            builtin_strncpy(local_ff0.impl_.stream_.buffer_.cur_,
                            "flyd_write_request_handler数据发送完毕 ，很好！",0x39);
            local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x39;
          }
          muduo::Logger::~Logger(&local_ff0);
        }
      }
      iVar1 = sem_post((sem_t *)&this->m_semEventSendQueue);
      if (iVar1 == -1) {
        file_01._8_8_ = 0x16;
        file_01.data_ = "flyd_socket_request.cc";
        muduo::Logger::Logger(&local_ff0,file_01,0x19a,ERROR);
        if (0x4c < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
          memcpy(local_ff0.impl_.stream_.buffer_.cur_,anon_var_dwarf_35111,0x4c);
          local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x4c;
        }
        muduo::Logger::~Logger(&local_ff0);
      }
      CMemory::FreeMemory(this_00,pConn->psendMemPointer);
      pConn->psendMemPointer = (char *)0x0;
      LOCK();
      (pConn->iThrowsendCount).value_ = (pConn->iThrowsendCount).value_ + -1;
      UNLOCK();
    }
  }
  else {
    pConn->psendbuf = pConn->psendbuf + uVar2;
    pConn->isendlen = pConn->isendlen - (int)uVar2;
  }
  return;
}

Assistant:

void CSocekt::flyd_write_request_handler(lp_connection_t pConn)
{  
    CMemory *p_memory = CMemory::GetInstance();
    
    //这些代码的书写可以参照 void* CSocekt::ServerSendQueueThread(void* threadData)
    ssize_t sendsize = sendproc(pConn,pConn->psendbuf,pConn->isendlen);

    if(sendsize > 0 && sendsize != pConn->isendlen)
    {        
        //没有全部发送完毕，数据只发出去了一部分，那么发送到了哪里，剩余多少，继续记录，方便下次sendproc()时使用
        pConn->psendbuf = pConn->psendbuf + sendsize;
		pConn->isendlen = pConn->isendlen - sendsize;	
        return;
    }
    else if(sendsize == -1)
    {
        //这不太可能，可以发送数据时通知我发送数据，我发送时你却通知我发送缓冲区满？
        LOG_ERROR << "CSocekt::ngx_write_request_handler()时if(sendsize == -1)成立，这很怪异。";
        return;
    }

    if(sendsize > 0 && sendsize == pConn->isendlen) //成功发送完毕，做个通知是可以的；
    {
        //如果是成功的发送完毕数据，则把写事件通知从epoll中干掉吧；其他情况，那就是断线了，等着系统内核把连接从红黑树中干掉即可；
        if(flyd_epoll_oper_event(
                pConn->fd,          //socket句柄
                EPOLL_CTL_MOD,      //事件类型，这里是修改【因为我们准备减去写通知】
                EPOLLOUT,           //标志，这里代表要减去的标志,EPOLLOUT：可写【可写的时候通知我】
                1,                  //对于事件类型为增加的，EPOLL_CTL_MOD需要这个参数, 0：增加   1：去掉 2：完全覆盖
                pConn               //连接池中的连接
                ) == -1)
        {
            //有这情况发生？这可比较麻烦，不过先do nothing
            LOG_ERROR << "CSocekt::ngx_write_request_handler()时if(sendsize == -1)成立，这很怪异。";
        }    

            LOG_INFO << "flyd_write_request_handler数据发送完毕 ，很好！"  ;      
    }

    //能走下来的，要么数据发送完毕了，要么对端断开了，那么执行收尾工作吧；

    //数据发送完毕，或者把需要发送的数据干掉，都说明发送缓冲区可能有地方了，让发送线程往下走判断能否发送新数据
    if(sem_post(&m_semEventSendQueue)==-1)     
            LOG_ERROR << "CSocekt::ngx_write_request_handler()中sem_post(&m_semEventSendQueue)失败.";


    p_memory->FreeMemory(pConn->psendMemPointer);  //释放内存
    pConn->psendMemPointer = NULL;        
    pConn->iThrowsendCount.decrement();  //建议放在最后执行
    return;
}